

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O1

void uECC_vli_bytesToNative(uECC_word_t *native,uint8_t *bytes,int num_bytes)

{
  ulong *puVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = num_bytes + 0xe;
  if (-1 < num_bytes + 7) {
    iVar3 = num_bytes + 7;
  }
  if ('\0' < (char)(iVar3 >> 3)) {
    memset(native,0,(ulong)((iVar3 >> 3 & 0x7fU) << 3));
  }
  if (0 < num_bytes) {
    uVar4 = 0;
    cVar2 = '\0';
    do {
      puVar1 = (ulong *)((long)native + (ulong)(~uVar4 + num_bytes & 0xfffffff8));
      *puVar1 = *puVar1 | (ulong)bytes[cVar2] << ((char)(~uVar4 + num_bytes) * '\b' & 0x3fU);
      cVar2 = cVar2 + '\x01';
      uVar4 = (uint)cVar2;
    } while ((int)uVar4 < num_bytes);
  }
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_bytesToNative(uECC_word_t *native,
                                         const uint8_t *bytes,
                                         int num_bytes) {
    wordcount_t i;
    uECC_vli_clear(native, (num_bytes + (uECC_WORD_SIZE - 1)) / uECC_WORD_SIZE);
    for (i = 0; i < num_bytes; ++i) {
        unsigned b = num_bytes - 1 - i;
        native[b / uECC_WORD_SIZE] |=
            (uECC_word_t)bytes[i] << (8 * (b % uECC_WORD_SIZE));
    }
}